

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_2::GeometryExpanderRenderTest::createInstance
          (GeometryExpanderRenderTest *this,Context *context)

{
  VkPrimitiveTopology primitiveType;
  TestInstance *this_00;
  char *name;
  Context *context_local;
  GeometryExpanderRenderTest *this_local;
  
  this_00 = (TestInstance *)operator_new(0x70);
  primitiveType = this->m_primitiveType;
  name = tcu::TestNode::getName((TestNode *)this);
  GeometryInputTestInstance::GeometryInputTestInstance
            ((GeometryInputTestInstance *)this_00,context,primitiveType,name);
  return this_00;
}

Assistant:

TestInstance* GeometryExpanderRenderTest::createInstance (Context& context) const
{
	return new GeometryInputTestInstance(context, m_primitiveType, getName());
}